

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> cont)

{
  const_iterator pMVar1;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDI;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *x;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *__range2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff98;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_ffffffffffffffa0;
  const_iterator local_28;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_10;
  
  std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
            (&local_10);
  Stack(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  local_28 = std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
             ::begin(&local_10);
  pMVar1 = std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::
           end(in_RDI);
  for (; local_28 != pMVar1; local_28 = local_28 + 1) {
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x3767fe);
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }